

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testInit
          (XFBInvalidOffsetAlignmentTest *this)

{
  pointer *pptVar1;
  iterator __position;
  GLuint GVar2;
  ulong uVar3;
  GLuint index;
  XFBInvalidOffsetAlignmentTest *this_00;
  GLuint GVar4;
  GLuint stage;
  STAGES SVar5;
  Type TVar6;
  testCase local_4c;
  XFBInvalidOffsetAlignmentTest *local_38;
  
  local_38 = (XFBInvalidOffsetAlignmentTest *)&this->m_test_cases;
  index = 0;
  this_00 = this;
  do {
    TVar6 = TestBase::getType((TestBase *)this_00,index);
    uVar3 = TVar6._0_8_;
    this_00 = (XFBInvalidOffsetAlignmentTest *)(uVar3 & 0xffffffff);
    GVar2 = Utils::Type::GetTypeSize(TVar6.m_basic_type);
    SVar5 = COMPUTE;
    do {
      if (((SVar5 != FRAGMENT) && ((SVar5 & FRAGMENT) != COMPUTE)) && (GVar2 + 1 < GVar2 * 2)) {
        GVar4 = 1;
        do {
          local_4c.m_offset = GVar4 + GVar2;
          __position._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_4c.m_stage = SVar5;
          local_4c.m_type = TVar6;
          if (__position._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_00 = local_38;
            std::
            vector<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>>
                        *)local_38,__position,&local_4c);
          }
          else {
            local_4c.m_type.m_n_rows = TVar6.m_n_rows;
            ((__position._M_current)->m_type).m_n_rows = local_4c.m_type.m_n_rows;
            (__position._M_current)->m_offset = local_4c.m_offset;
            (__position._M_current)->m_stage = SVar5;
            ((__position._M_current)->m_type).m_basic_type = (int)uVar3;
            ((__position._M_current)->m_type).m_n_columns = (int)(uVar3 >> 0x20);
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInvalidOffsetAlignmentTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
          GVar4 = GVar4 + 1;
        } while (GVar2 != GVar4);
      }
      SVar5 = SVar5 + VERTEX;
    } while (SVar5 != STAGE_MAX);
    index = index + 1;
  } while (index != 0x22);
  return;
}

Assistant:

void XFBInvalidOffsetAlignmentTest::testInit()
{
	const GLuint n_types = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type			  = getType(i);
		const GLuint	   base_alingment = Utils::Type::GetTypeSize(type.m_basic_type);

		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
				(Utils::Shader::FRAGMENT == stage))
			{
				continue;
			}

			for (GLuint offset = base_alingment + 1; offset < 2 * base_alingment; ++offset)
			{
				testCase test_case = { offset, (Utils::Shader::STAGES)stage, type };

				m_test_cases.push_back(test_case);
			}
		}
	}
}